

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::normal_dist<float>::pdf(normal_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  result_type_conflict1 rVar4;
  double dVar5;
  result_type_conflict1 t;
  
  rVar1 = param_type::mu(in_RDI);
  rVar2 = param_type::sigma(in_RDI);
  rVar3 = param_type::sigma(in_RDI);
  rVar4 = param_type::sigma(in_RDI);
  dVar5 = std::exp((double)(ulong)(uint)(((in_XMM0_Da - rVar1) * (in_XMM0_Da - rVar1)) /
                                        (rVar3 * -2.0 * rVar4)));
  return (0.3989423 / rVar2) * SUB84(dVar5,0);
}

Assistant:

pdf(result_type x) const {
      const result_type t{x - P.mu()};
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(t * t / (-2 * P.sigma() * P.sigma()));
    }